

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

void __thiscall
QStyleSheetStyle::drawPrimitive
          (QStyleSheetStyle *this,PrimitiveElement pe,QStyleOption *opt,QPainter *p,QWidget *w)

{
  long lVar1;
  QWidgetData *pQVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  QStyleSheetStyle *pQVar7;
  bool bVar8;
  bool bVar9;
  char cVar10;
  int iVar11;
  ColorRole cr;
  QStyle *pQVar12;
  QAbstractButton *pQVar13;
  QStyleOptionViewItem *pQVar14;
  QWidget *obj;
  QStyleOptionHeader *pQVar15;
  QStyleOptionTabWidgetFrame *other;
  QAbstractScrollArea *this_00;
  undefined8 uVar16;
  QScrollBar *pQVar17;
  undefined7 extraout_var;
  QStyleOptionFrame *pQVar18;
  QObject *pQVar19;
  QStyleOptionFrame *rect;
  int iVar20;
  long lVar21;
  long in_FS_OFFSET;
  undefined1 auVar22 [16];
  QRect QVar23;
  undefined8 uStack_220;
  int local_210;
  QRect local_1e8;
  QStyleOptionTabWidgetFrame frmCopy;
  QRenderRule rule;
  QStyleOptionFrame frmOpt;
  
  pQVar7 = globalStyleSheetStyle;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (globalStyleSheetStyle != (QStyleSheetStyle *)this &&
      globalStyleSheetStyle != (QStyleSheetStyle *)0x0) {
    pQVar12 = baseStyle(this);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      (**(code **)(*(long *)pQVar12 + 0xb0))(pQVar12,pe,opt,p,w,*(code **)(*(long *)pQVar12 + 0xb0))
      ;
      return;
    }
    goto LAB_0034cc0b;
  }
  if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)this;
  }
  memset(&rule,0xaa,0x88);
  renderRule(&rule,this,&w->super_QObject,opt,0);
  local_1e8.x1.m_i = (opt->rect).x1.m_i;
  local_1e8.y1.m_i = (opt->rect).y1.m_i;
  local_1e8.x2.m_i = (opt->rect).x2.m_i;
  local_1e8.y2.m_i = (opt->rect).y2.m_i;
  if (PE_PanelMenu < pe) goto switchD_0034bbe7_caseD_5;
  rect = (QStyleOptionFrame *)&opt->rect;
  local_210 = 1;
  switch(pe) {
  case PE_Frame:
  case PE_FrameDockWidget:
  case PE_FrameWindow:
    pQVar18 = qstyleoption_cast<QStyleOptionFrame_const*>(opt);
    if (pQVar18 != (QStyleOptionFrame *)0x0) {
      if ((rule.bd.d.ptr != (QStyleSheetBorderData *)0x0) &&
         ((*(long *)((long)rule.bd.d.ptr + 0x68) != 0 ||
          (*(int *)((long)rule.bd.d.ptr + 0x38) != 0xc)))) {
        frmOpt.super_QStyleOption._0_16_ = QRenderRule::borderRect(&rule,(QRect *)rect);
        rect = &frmOpt;
        goto LAB_0034c903;
      }
      frmOpt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
      frmOpt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
      frmOpt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      frmOpt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      frmOpt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      frmOpt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      frmOpt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      frmOpt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      frmOpt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      frmOpt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionFrame::QStyleOptionFrame(&frmOpt,pQVar18);
      QRenderRule::configurePalette(&rule,&frmOpt.super_QStyleOption.palette,Text,Base);
      pQVar12 = baseStyle(this);
      lVar21 = *(long *)pQVar12;
LAB_0034bc95:
      (**(code **)(lVar21 + 0xb0))(pQVar12,pe,&frmOpt,p,w);
LAB_0034bc9f:
      QStyleOption::~QStyleOption(&frmOpt.super_QStyleOption);
    }
    goto LAB_0034ca00;
  case PE_FrameDefaultButton:
    if ((rule.bd.d.ptr == (QStyleSheetBorderData *)0x0) ||
       ((*(long *)((long)rule.bd.d.ptr + 0x68) == 0 && (*(int *)((long)rule.bd.d.ptr + 0x38) == 0xc)
        ))) {
      bVar9 = QRenderRule::baseStyleCanDraw(&rule);
      if (bVar9) goto switchD_0034bbe7_caseD_5;
      QWindowsStyle::drawPrimitive((QWindowsStyle *)this,PE_FrameDefaultButton,opt,p,w);
    }
    goto LAB_0034ca00;
  case PE_FrameFocusRect:
    if ((rule.ou.d.ptr == (QStyleSheetOutlineData *)0x0) ||
       ((*(long *)((long)rule.ou.d.ptr + 0x68) == 0 && (*(int *)((long)rule.ou.d.ptr + 0x38) == 0xc)
        ))) goto switchD_0034bbe7_caseD_5;
    QRenderRule::drawOutline(&rule,p,(QRect *)rect);
    goto LAB_0034ca00;
  case PE_FrameGroupBox:
    if ((rule.bd.d.ptr == (QStyleSheetBorderData *)0x0) ||
       ((*(long *)((long)rule.bd.d.ptr + 0x68) == 0 && (*(int *)((long)rule.bd.d.ptr + 0x38) == 0xc)
        ))) goto switchD_0034bbe7_caseD_5;
LAB_0034c903:
    QRenderRule::drawBorder(&rule,p,(QRect *)rect);
    goto LAB_0034ca00;
  default:
    goto switchD_0034bbe7_caseD_5;
  case PE_FrameMenu:
  case PE_PanelMenuBar:
    bVar9 = QRenderRule::hasDrawable(&rule);
    if (!bVar9) goto switchD_0034bbe7_caseD_5;
    goto LAB_0034ca00;
  case PE_FrameStatusBarItem:
    memset(&frmOpt,0xaa,0x88);
    if (w == (QWidget *)0x0) {
      pQVar19 = (QObject *)0x0;
    }
    else {
      pQVar19 = *(QObject **)(*(long *)&w->field_0x8 + 0x10);
    }
    renderRule((QRenderRule *)&frmOpt,this,pQVar19,opt,10);
    goto LAB_0034c92c;
  case PE_FrameTabWidget:
    other = qstyleoption_cast<QStyleOptionTabWidgetFrame_const*>(opt);
    if (other == (QStyleOptionTabWidgetFrame *)0x0) goto switchD_0034bbe7_caseD_5;
    memset((QRenderRule *)&frmOpt,0xaa,0x88);
    renderRule((QRenderRule *)&frmOpt,this,&w->super_QObject,opt,0x36);
    if ((frmOpt._72_8_ == 0) ||
       ((*(long *)(frmOpt._72_8_ + 0x68) == 0 && (*(int *)(frmOpt._72_8_ + 0x38) == 0xc)))) {
      auVar4._8_8_ = 0;
      auVar4._0_4_ = frmCopy.super_QStyleOption.state.
                     super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                     super_QFlagsStorage<QStyle::StateFlag>.i;
      auVar4._4_4_ = frmCopy.super_QStyleOption.direction;
      frmCopy.super_QStyleOption._0_16_ = auVar4 << 0x40;
      QRenderRule::drawBackground((QRenderRule *)&frmOpt,p,(QRect *)rect,(QPoint *)&frmCopy);
      memset(&frmCopy,0xaa,0x88);
      QStyleOptionTabWidgetFrame::QStyleOptionTabWidgetFrame(&frmCopy,other);
      QRenderRule::configurePalette
                ((QRenderRule *)&frmOpt,&frmCopy.super_QStyleOption.palette,WindowText,Window);
      pQVar12 = baseStyle(this);
      (**(code **)(*(long *)pQVar12 + 0xb0))(pQVar12,8,&frmCopy,p,w);
      QStyleOption::~QStyleOption(&frmCopy.super_QStyleOption);
    }
    else {
LAB_0034c6ec:
      QRenderRule::drawRule((QRenderRule *)&frmOpt,p,(QRect *)rect);
    }
    goto LAB_0034cb14;
  case PE_PanelButtonCommand:
  case PE_PanelButtonTool:
    pQVar13 = QtPrivate::qobject_cast_helper<QAbstractButton_const*,QObject_const>
                        (&w->super_QObject);
    if (((pQVar13 == (QAbstractButton *)0x0) || (bVar9 = QRenderRule::hasBackground(&rule), !bVar9))
       || ((rule.bd.d.ptr != (QStyleSheetBorderData *)0x0 &&
           ((*(long *)((long)rule.bd.d.ptr + 0x68) != 0 ||
            (*(int *)((long)rule.bd.d.ptr + 0x38) != 0xc)))))) {
      if ((rule.bd.d.ptr == (QStyleSheetBorderData *)0x0) ||
         ((*(long *)((long)rule.bd.d.ptr + 0x68) == 0 &&
          (*(int *)((long)rule.bd.d.ptr + 0x38) == 0xc)))) goto switchD_0034bbe7_caseD_5;
      frmOpt.super_QStyleOption._0_16_ = QRenderRule::boxRect(&rule,(QRect *)rect,1);
      rect = &frmOpt;
    }
    else {
      QWindowsStyle::drawPrimitive((QWindowsStyle *)this,pe,opt,p,w);
      cVar10 = QPixmap::isNull();
      if ((cVar10 != '\0') && (rule.img.d.ptr == (QStyleSheetImageData *)0x0)) goto LAB_0034ca00;
      QVar23 = QRenderRule::boxRect(&rule,(QRect *)rect,1);
      auVar22._12_4_ = QVar23.y2.m_i;
      auVar22._0_4_ = (undefined4)(QVar23._0_8_ + 1);
      auVar22._8_4_ = (undefined4)(QVar23._8_8_ + 0xffffffff);
      auVar22._4_4_ = auVar22._8_4_;
      rect = &frmOpt;
      frmOpt.super_QStyleOption._8_8_ = auVar22._8_8_ + -0x100000000;
      frmOpt.super_QStyleOption._0_8_ = CONCAT44(QVar23.y1.m_i.m_i,auVar22._0_4_) + 0x100000000;
    }
LAB_0034c5d9:
    QRenderRule::drawRule(&rule,p,(QRect *)rect);
    goto LAB_0034ca00;
  case PE_PanelLineEdit:
    pQVar18 = qstyleoption_cast<QStyleOptionFrame_const*>(opt);
    if (pQVar18 != (QStyleOptionFrame *)0x0) {
      if ((w != (QWidget *)0x0) && (obj = containerWidget(w), obj != w)) {
        memset(&frmOpt,0xaa,0x88);
        renderRule((QRenderRule *)&frmOpt,this,&obj->super_QObject,opt,0);
        if (((frmOpt._72_8_ != 0) &&
            ((*(long *)(frmOpt._72_8_ + 0x68) != 0 || (*(int *)(frmOpt._72_8_ + 0x38) != 0xc)))) ||
           (bVar9 = QRenderRule::baseStyleCanDraw((QRenderRule *)&frmOpt), !bVar9))
        goto LAB_0034cb14;
        QRenderRule::operator=(&rule,(QRenderRule *)&frmOpt);
        QRenderRule::~QRenderRule((QRenderRule *)&frmOpt);
      }
      if ((rule.bd.d.ptr != (QStyleSheetBorderData *)0x0) &&
         ((*(long *)((long)rule.bd.d.ptr + 0x68) != 0 ||
          (*(int *)((long)rule.bd.d.ptr + 0x38) != 0xc)))) goto LAB_0034c5d9;
      frmOpt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
      frmOpt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
      frmOpt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      frmOpt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      frmOpt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      frmOpt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      frmOpt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      frmOpt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      frmOpt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      frmOpt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionFrame::QStyleOptionFrame(&frmOpt,pQVar18);
      QRenderRule::configurePalette(&rule,&frmOpt.super_QStyleOption.palette,Text,Base);
      frmOpt.super_QStyleOption.rect =
           QRenderRule::borderRect(&rule,&frmOpt.super_QStyleOption.rect);
      bVar9 = QRenderRule::baseStyleCanDraw(&rule);
      if (bVar9) {
        QRenderRule::drawBackgroundImage(&rule,p,(QRect *)rect,(QPoint)0x0);
        uStack_220 = 0x12;
      }
      else {
        auVar6._8_8_ = 0;
        auVar6._0_4_ = frmCopy.super_QStyleOption.state.
                       super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                       super_QFlagsStorage<QStyle::StateFlag>.i;
        auVar6._4_4_ = frmCopy.super_QStyleOption.direction;
        frmCopy.super_QStyleOption._0_16_ = auVar6 << 0x40;
        QRenderRule::drawBackground(&rule,p,(QRect *)rect,(QPoint *)&frmCopy);
        if (frmOpt.lineWidth < 1) goto LAB_0034bc9f;
        uStack_220 = 5;
      }
      pQVar12 = baseStyle(this);
      (**(code **)(*(long *)pQVar12 + 0xb0))(pQVar12,uStack_220,&frmOpt,p,w);
      goto LAB_0034bc9f;
    }
    goto LAB_0034ca00;
  case PE_IndicatorArrowDown:
    break;
  case PE_IndicatorArrowLeft:
    local_210 = 3;
    break;
  case PE_IndicatorArrowRight:
switchD_0034bbe7_caseD_15:
    local_210 = 4;
    break;
  case PE_IndicatorArrowUp:
    local_210 = 2;
    break;
  case PE_IndicatorBranch:
    pQVar14 = qstyleoption_cast<QStyleOptionViewItem_const*>(opt);
    if (pQVar14 != (QStyleOptionViewItem *)0x0) {
      memset(&frmOpt,0xaa,0x88);
      renderRule((QRenderRule *)&frmOpt,this,&w->super_QObject,opt,0x29);
      bVar9 = QRenderRule::hasDrawable((QRenderRule *)&frmOpt);
      if (bVar9) {
        pQVar12 = QStyle::proxy((QStyle *)CONCAT71(extraout_var,bVar9));
        (**(code **)(*(long *)pQVar12 + 0xb0))(pQVar12,0x2d,pQVar14,p,w);
        goto LAB_0034c6ec;
      }
      pQVar12 = baseStyle(this);
      (**(code **)(*(long *)pQVar12 + 0xb0))(pQVar12,0x17,pQVar14,p,w);
      goto LAB_0034cb14;
    }
    goto LAB_0034ca00;
  case PE_IndicatorButtonDropDown:
    memset((QRenderRule *)&frmOpt,0xaa,0x88);
    renderRule((QRenderRule *)&frmOpt,this,&w->super_QObject,opt,0x11);
    if ((frmOpt._72_8_ != 0) &&
       ((*(long *)(frmOpt._72_8_ + 0x68) != 0 || (*(int *)(frmOpt._72_8_ + 0x38) != 0xc)))) {
      QRenderRule::drawBorder(&rule,p,(QRect *)rect);
      goto LAB_0034cb14;
    }
    goto LAB_0034c955;
  case PE_IndicatorItemViewItemCheck:
    local_210 = 0x4d;
    break;
  case PE_IndicatorCheckBox:
    local_210 = 5;
    break;
  case PE_IndicatorDockWidgetResizeHandle:
    local_210 = 0x3d;
    break;
  case PE_IndicatorHeaderArrow:
    pQVar15 = qstyleoption_cast<QStyleOptionHeader_const*>(opt);
    if (pQVar15 != (QStyleOptionHeader *)0x0) {
      local_210 = (pQVar15->sortIndicator != SortUp) + 0x2b;
      break;
    }
    goto switchD_0034bbe7_caseD_5;
  case PE_IndicatorMenuCheckMark:
    local_210 = 0x25;
    break;
  case PE_IndicatorProgressChunk:
    local_210 = 0x2d;
    break;
  case PE_IndicatorRadioButton:
    local_210 = 6;
    break;
  case PE_IndicatorSpinDown:
  case PE_IndicatorSpinMinus:
    local_210 = 0xe;
    break;
  case PE_IndicatorSpinPlus:
  case PE_IndicatorSpinUp:
    local_210 = 0xc;
    break;
  case PE_IndicatorToolBarHandle:
  case PE_IndicatorToolBarSeparator:
    memset(&frmOpt,0xaa,0x88);
    renderRule((QRenderRule *)&frmOpt,this,&w->super_QObject,opt,
               (pe != PE_IndicatorToolBarHandle) + 0x21);
LAB_0034c92c:
    bVar9 = QRenderRule::hasDrawable((QRenderRule *)&frmOpt);
    if (!bVar9) {
LAB_0034c955:
      QRenderRule::~QRenderRule((QRenderRule *)&frmOpt);
      goto switchD_0034bbe7_caseD_5;
    }
    QRenderRule::drawRule((QRenderRule *)&frmOpt,p,(QRect *)rect);
LAB_0034cb14:
    QRenderRule::~QRenderRule((QRenderRule *)&frmOpt);
    goto LAB_0034ca00;
  case PE_PanelTipLabel:
    bVar9 = QRenderRule::hasDrawable(&rule);
    if (!bVar9) goto switchD_0034bbe7_caseD_5;
    pQVar18 = qstyleoption_cast<QStyleOptionFrame_const*>(opt);
    if (pQVar18 != (QStyleOptionFrame *)0x0) {
      if ((rule.bd.d.ptr != (QStyleSheetBorderData *)0x0) &&
         ((*(long *)((long)rule.bd.d.ptr + 0x68) != 0 ||
          (*(int *)((long)rule.bd.d.ptr + 0x38) != 0xc)))) goto LAB_0034c5d9;
      auVar5._8_8_ = 0;
      auVar5._0_4_ = frmOpt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>
                     .super_QFlagsStorage<QStyle::StateFlag>.i;
      auVar5._4_4_ = frmOpt.super_QStyleOption.direction;
      frmOpt.super_QStyleOption._0_16_ = auVar5 << 0x40;
      QRenderRule::drawBackground(&rule,p,(QRect *)rect,(QPoint *)&frmOpt);
      frmOpt._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
      frmOpt._72_8_ = &DAT_aaaaaaaaaaaaaaaa;
      frmOpt.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      frmOpt.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      frmOpt.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
      frmOpt.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      frmOpt.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      frmOpt.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      frmOpt.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      frmOpt.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QStyleOptionFrame::QStyleOptionFrame(&frmOpt,pQVar18);
      frmOpt.super_QStyleOption.rect = QRenderRule::borderRect(&rule,(QRect *)rect);
      QBrush::QBrush((QBrush *)&frmCopy,NoBrush);
      QPalette::setBrush(&frmOpt.super_QStyleOption.palette,Window,(QBrush *)&frmCopy);
      QBrush::~QBrush((QBrush *)&frmCopy);
      pQVar12 = baseStyle(this);
      lVar21 = *(long *)pQVar12;
      pe = PE_PanelTipLabel;
      goto LAB_0034bc95;
    }
    goto LAB_0034ca00;
  case PE_IndicatorTabTear:
    local_210 = 0x30;
    break;
  case PE_PanelScrollAreaCorner:
    local_210 = 0x4e;
    break;
  case PE_Widget:
    if (w != (QWidget *)0x0) {
      bVar9 = QRenderRule::hasDrawable(&rule);
      if (!bVar9) {
        frmCopy.super_QStyleOption._0_8_ = containerWidget(w);
        bVar9 = QHash<const_QWidget_*,_QHashDummyValue>::contains
                          (&(styleSheetCaches->autoFillDisabledWidgets).q_hash,(QWidget **)&frmCopy)
        ;
        if (bVar9) {
          if ((QWidget *)frmCopy.super_QStyleOption._0_8_ != w) {
            renderRule((QRenderRule *)&frmOpt,this,(QObject *)frmCopy.super_QStyleOption._0_8_,opt,0
                      );
            bVar9 = QRenderRule::hasBackground((QRenderRule *)&frmOpt);
            QRenderRule::~QRenderRule((QRenderRule *)&frmOpt);
            if (bVar9) goto switchD_0034bbe7_caseD_5;
          }
          cr = QWidget::backgroundRole(w);
          QPalette::brush(&opt->palette,cr);
          QPainter::fillRect((QRect *)p,(QBrush *)rect);
        }
        goto switchD_0034bbe7_caseD_5;
      }
    }
    this_00 = (QAbstractScrollArea *)
              QtPrivate::qobject_cast_helper<QAbstractScrollArea_const*,QObject_const>
                        (&w->super_QObject);
    if (this_00 == (QAbstractScrollArea *)0x0) goto switchD_0034bbe7_caseD_2e;
    uVar16 = (**(code **)(**(long **)(this_00 + 8) + 0xb8))();
    frmOpt.super_QStyleOption.version = (int)uVar16;
    frmOpt.super_QStyleOption.type = (int)((ulong)uVar16 >> 0x20);
    QRenderRule::drawBackground(&rule,p,(QRect *)rect,(QPoint *)&frmOpt);
    if (rule.bd.d.ptr != (QStyleSheetBorderData *)0x0) {
      frmOpt.super_QStyleOption._0_16_ = QRenderRule::borderRect(&rule,(QRect *)rect);
      iVar20 = 0;
      iVar11 = (**(code **)(*(long *)this + 0xf0))(this,0x11,opt,w,0);
      if (iVar11 != 0) {
        pQVar17 = QAbstractScrollArea::verticalScrollBar(this_00);
        if ((((pQVar17->super_QAbstractSlider).super_QWidget.data)->widget_attributes & 0x8000) != 0
           ) {
          pQVar17 = QAbstractScrollArea::verticalScrollBar(this_00);
          pQVar2 = (pQVar17->super_QAbstractSlider).super_QWidget.data;
          iVar20 = ~(pQVar2->crect).x2.m_i + (pQVar2->crect).x1.m_i;
        }
        pQVar17 = QAbstractScrollArea::horizontalScrollBar(this_00);
        iVar11 = 0;
        if ((((pQVar17->super_QAbstractSlider).super_QWidget.data)->widget_attributes & 0x8000) != 0
           ) {
          pQVar17 = QAbstractScrollArea::horizontalScrollBar(this_00);
          pQVar2 = (pQVar17->super_QAbstractSlider).super_QWidget.data;
          iVar11 = ~(pQVar2->crect).y2.m_i + (pQVar2->crect).y1.m_i;
        }
        auVar3 = (undefined1  [16])frmOpt.super_QStyleOption._0_16_;
        frmCopy.super_QStyleOption.direction = iVar11 + frmOpt.super_QStyleOption.direction;
        frmCopy.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
        super_QFlagsStorage<QStyle::StateFlag>.i =
             (QFlagsStorageHelper<QStyle::StateFlag,_4>)
             (QFlagsStorageHelper<QStyle::StateFlag,_4>)
             (iVar20 + (int)frmOpt.super_QStyleOption.state.
                            super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                            super_QFlagsStorage<QStyle::StateFlag>.i);
        frmCopy.super_QStyleOption.version = frmOpt.super_QStyleOption.version;
        frmCopy.super_QStyleOption.type = frmOpt.super_QStyleOption.type;
        frmOpt.super_QStyleOption._0_16_ = auVar3;
        frmOpt.super_QStyleOption._0_16_ =
             QStyle::visualRect(opt->direction,(QRect *)&frmOpt,(QRect *)&frmCopy);
      }
      QRenderRule::drawBorder(&rule,p,(QRect *)&frmOpt);
    }
    goto switchD_0034bbe7_caseD_5;
  case PE_IndicatorColumnViewArrow:
    pQVar14 = qstyleoption_cast<QStyleOptionViewItem_const*>(opt);
    if (pQVar14 == (QStyleOptionViewItem *)0x0) goto switchD_0034bbe7_caseD_15;
    local_210 = ((pQVar14->super_QStyleOption).direction != RightToLeft) + 3;
    break;
  case PE_PanelItemViewItem:
    local_210 = 0x4a;
    break;
  case PE_PanelItemViewRow:
    pQVar14 = qstyleoption_cast<QStyleOptionViewItem_const*>(opt);
    if ((pQVar14 != (QStyleOptionViewItem *)0x0) && (pQVar14->viewItemPosition != Invalid)) {
      memset(&frmOpt,0xaa,0x88);
      local_210 = 0x4a;
      renderRule((QRenderRule *)&frmOpt,this,&w->super_QObject,opt,0x4a);
      bVar8 = QRenderRule::hasBackground((QRenderRule *)&frmOpt);
      bVar9 = true;
      if (bVar8) {
        iVar11 = QColor::alpha();
        if (iVar11 != 1) {
          pQVar12 = baseStyle(this);
          (**(code **)(*(long *)pQVar12 + 0xb0))(pQVar12,0x2d,opt,p,w);
        }
        if ((((pQVar14->features).
              super_QFlagsStorageHelper<QStyleOptionViewItem::ViewItemFeature,_4>.
              super_QFlagsStorage<QStyleOptionViewItem::ViewItemFeature>.i & 0x40) != 0) &&
           (((pQVar14->viewItemPosition == OnlyOne || (pQVar14->viewItemPosition == Beginning)) &&
            (frmOpt._72_8_ != 0)))) {
          bVar8 = QRenderRule::hasDrawable((QRenderRule *)&frmOpt);
          if (bVar8) {
            auVar3._8_8_ = 0;
            auVar3._0_4_ = frmCopy.super_QStyleOption.state.
                           super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                           super_QFlagsStorage<QStyle::StateFlag>.i;
            auVar3._4_4_ = frmCopy.super_QStyleOption.direction;
            frmCopy.super_QStyleOption._0_16_ = auVar3 << 0x40;
            QRenderRule::drawBackground((QRenderRule *)&frmOpt,p,&local_1e8,(QPoint *)&frmCopy);
            frmCopy.super_QStyleOption._0_16_ =
                 QRenderRule::contentsRect((QRenderRule *)&frmOpt,&local_1e8);
            QRenderRule::drawImage((QRenderRule *)&frmOpt,p,(QRect *)&frmCopy);
          }
          else {
            pQVar12 = baseStyle(this);
            (**(code **)(*(long *)pQVar12 + 0xb0))(pQVar12,0x2d,opt,p,w);
          }
          bVar8 = false;
          goto LAB_0034cb38;
        }
        bVar9 = false;
        bVar8 = true;
      }
      else {
        bVar8 = true;
LAB_0034cb38:
        local_210 = 0;
      }
      QRenderRule::~QRenderRule((QRenderRule *)&frmOpt);
      if (!bVar8) goto LAB_0034ca00;
      if (!bVar9) break;
    }
    goto switchD_0034bbe7_caseD_5;
  case PE_PanelStatusBar:
  case PE_PanelMenu:
switchD_0034bbe7_caseD_2e:
    bVar9 = QRenderRule::hasDrawable(&rule);
    if (bVar9) goto LAB_0034c5d9;
switchD_0034bbe7_caseD_5:
    pQVar12 = baseStyle(this);
    (**(code **)(*(long *)pQVar12 + 0xb0))(pQVar12,pe,opt,p,w);
    goto LAB_0034c988;
  case PE_IndicatorTabClose:
    local_210 = 0x4f;
    if (w == (QWidget *)0x0) {
      w = (QWidget *)0x0;
    }
    else {
      pQVar19 = &baseStyle(this)->super_QObject;
      frmCopy.super_QStyleOption._0_8_ = w;
      ::QVariant::fromValue<void_*,_true>
                ((enable_if_t<std::conjunction_v<std::is_copy_constructible<void_*>,_std::is_destructible<void_*>_>,_QVariant>
                  *)&frmOpt,(void **)&frmCopy);
      QObject::setProperty(pQVar19,"_q_styleSheetRealCloseButton",(QVariant *)&frmOpt);
      ::QVariant::~QVariant((QVariant *)&frmOpt);
      local_210 = 0x4f;
      w = *(QWidget **)(*(long *)&w->field_0x8 + 0x10);
    }
  }
  memset((QRenderRule *)&frmOpt,0xaa,0x88);
  renderRule((QRenderRule *)&frmOpt,this,&w->super_QObject,opt,local_210);
  bVar9 = QRenderRule::hasDrawable((QRenderRule *)&frmOpt);
  if (bVar9) {
    QRenderRule::drawRule((QRenderRule *)&frmOpt,p,&local_1e8);
  }
  else {
    pQVar12 = baseStyle(this);
    (**(code **)(*(long *)pQVar12 + 0xb0))(pQVar12,pe,opt,p,w);
  }
  QRenderRule::~QRenderRule((QRenderRule *)&frmOpt);
LAB_0034c988:
  baseStyle(this);
  QObject::property((char *)&frmOpt);
  cVar10 = ::QVariant::toBool();
  ::QVariant::~QVariant((QVariant *)&frmOpt);
  if (cVar10 != '\0') {
    pQVar19 = &baseStyle(this)->super_QObject;
    frmOpt.super_QStyleOption.version = 0;
    frmOpt.super_QStyleOption.type = 0;
    frmOpt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i = (QFlagsStorageHelper<QStyle::StateFlag,_4>)0x0;
    frmOpt.super_QStyleOption.direction = LeftToRight;
    frmOpt.super_QStyleOption.rect = (QRect)(ZEXT816(2) << 0x40);
    QObject::setProperty(pQVar19,"_q_styleSheetRealCloseButton",(QVariant *)&frmOpt);
    ::QVariant::~QVariant((QVariant *)&frmOpt);
  }
LAB_0034ca00:
  QRenderRule::~QRenderRule(&rule);
  if (pQVar7 == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_0034cc0b:
  __stack_chk_fail();
}

Assistant:

void QStyleSheetStyle::drawPrimitive(PrimitiveElement pe, const QStyleOption *opt, QPainter *p,
                                     const QWidget *w) const
{
    RECURSION_GUARD(baseStyle()->drawPrimitive(pe, opt, p, w); return)

    int pseudoElement = PseudoElement_None;
    QRenderRule rule = renderRule(w, opt);
    QRect rect = opt->rect;

    switch (pe) {

    case PE_FrameStatusBarItem: {
        QRenderRule subRule = renderRule(w ? w->parentWidget() : nullptr, opt, PseudoElement_Item);
        if (subRule.hasDrawable()) {
            subRule.drawRule(p, opt->rect);
            return;
        }
        break;
                            }

    case PE_IndicatorArrowDown:
        pseudoElement = PseudoElement_DownArrow;
        break;

    case PE_IndicatorArrowUp:
        pseudoElement = PseudoElement_UpArrow;
        break;

    case PE_IndicatorRadioButton:
        pseudoElement = PseudoElement_ExclusiveIndicator;
        break;

    case PE_IndicatorItemViewItemCheck:
        pseudoElement = PseudoElement_ViewItemIndicator;
        break;

    case PE_IndicatorCheckBox:
        pseudoElement = PseudoElement_Indicator;
        break;

    case PE_IndicatorHeaderArrow:
        if (const QStyleOptionHeader *hdr = qstyleoption_cast<const QStyleOptionHeader *>(opt)) {
            pseudoElement = hdr->sortIndicator == QStyleOptionHeader::SortUp
                ? PseudoElement_HeaderViewUpArrow
                : PseudoElement_HeaderViewDownArrow;
        }
        break;

    case PE_PanelButtonTool:
    case PE_PanelButtonCommand:
#if QT_CONFIG(abstractbutton)
        if (qobject_cast<const QAbstractButton *>(w) && rule.hasBackground() && rule.hasNativeBorder()) {
            //the window style will draw the borders
            ParentStyle::drawPrimitive(pe, opt, p, w);
            if (!rule.background()->pixmap.isNull() || rule.hasImage()) {
                rule.drawRule(p, rule.boxRect(opt->rect, QRenderRule::Margin).adjusted(1,1,-1,-1));
            }
            return;
        }
#endif
        if (!rule.hasNativeBorder()) {
            rule.drawRule(p, rule.boxRect(opt->rect, QRenderRule::Margin));
            return;
        }
        break;

    case PE_IndicatorButtonDropDown: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_ToolButtonMenu);
        if (!subRule.hasNativeBorder()) {
            rule.drawBorder(p, opt->rect);
            return;
        }
        break;
                                     }

    case PE_FrameDefaultButton:
        if (rule.hasNativeBorder()) {
            if (rule.baseStyleCanDraw())
                break;
            QWindowsStyle::drawPrimitive(pe, opt, p, w);
        }
        return;

    case PE_FrameWindow:
    case PE_FrameDockWidget:
    case PE_Frame:
        if (const QStyleOptionFrame *frm = qstyleoption_cast<const QStyleOptionFrame *>(opt)) {
            if (rule.hasNativeBorder()) {
                QStyleOptionFrame frmOpt(*frm);
                rule.configurePalette(&frmOpt.palette, QPalette::Text, QPalette::Base);
                baseStyle()->drawPrimitive(pe, &frmOpt, p, w);
            } else {
                rule.drawBorder(p, rule.borderRect(opt->rect));
            }
        }
        return;

    case PE_PanelLineEdit:
        if (const QStyleOptionFrame *frm = qstyleoption_cast<const QStyleOptionFrame *>(opt)) {
            // Fall back to container widget's render rule
            if (w) {
                if (QWidget *container = containerWidget(w); container != w) {
                    QRenderRule containerRule = renderRule(container, opt);
                    if (!containerRule.hasNativeBorder() || !containerRule.baseStyleCanDraw())
                        return;
                    rule = containerRule;
                }
            }

            if (rule.hasNativeBorder()) {
                QStyleOptionFrame frmOpt(*frm);
                rule.configurePalette(&frmOpt.palette, QPalette::Text, QPalette::Base);
                frmOpt.rect = rule.borderRect(frmOpt.rect);
                if (rule.baseStyleCanDraw()) {
                    rule.drawBackgroundImage(p, opt->rect);
                    baseStyle()->drawPrimitive(pe, &frmOpt, p, w);
                } else {
                    rule.drawBackground(p, opt->rect);
                    if (frmOpt.lineWidth > 0)
                        baseStyle()->drawPrimitive(PE_FrameLineEdit, &frmOpt, p, w);
                }
            } else {
                rule.drawRule(p, opt->rect);
            }
        }
        return;

    case PE_Widget:
        if (w && !rule.hasDrawable()) {
            QWidget *container = containerWidget(w);
            if (styleSheetCaches->autoFillDisabledWidgets.contains(container)
                && (container == w || !renderRule(container, opt).hasBackground())) {
                //we do not have a background, but we disabled the autofillbackground anyway. so fill the background now.
                // (this may happen if we have rules like :focus)
                p->fillRect(opt->rect, opt->palette.brush(w->backgroundRole()));
            }
            break;
        }
#if QT_CONFIG(scrollarea)
        if (const QAbstractScrollArea *sa = qobject_cast<const QAbstractScrollArea *>(w)) {
            const QAbstractScrollAreaPrivate *sap = sa->d_func();
            rule.drawBackground(p, opt->rect, sap->contentsOffset());
            if (rule.hasBorder()) {
                QRect brect = rule.borderRect(opt->rect);
                if (styleHint(QStyle::SH_ScrollView_FrameOnlyAroundContents, opt, w)) {
                    QRect r = brect.adjusted(0, 0, sa->verticalScrollBar()->isVisible() ? -sa->verticalScrollBar()->width() : 0,
                                             sa->horizontalScrollBar()->isVisible() ? -sa->horizontalScrollBar()->height() : 0);
                    brect = QStyle::visualRect(opt->direction, brect, r);
                }
                rule.drawBorder(p, brect);
            }
            break;
        }
#endif
        Q_FALLTHROUGH();
    case PE_PanelMenu:
    case PE_PanelStatusBar:
        if (rule.hasDrawable()) {
            rule.drawRule(p, opt->rect);
            return;
        }
    break;

    case PE_FrameMenu:
        if (rule.hasDrawable()) {
            // Drawn by PE_PanelMenu
            return;
        }
        break;

    case PE_PanelMenuBar:
    if (rule.hasDrawable()) {
        // Drawn by PE_Widget
        return;
    }
    break;

    case PE_IndicatorToolBarSeparator:
    case PE_IndicatorToolBarHandle: {
        PseudoElement ps = pe == PE_IndicatorToolBarHandle ? PseudoElement_ToolBarHandle : PseudoElement_ToolBarSeparator;
        QRenderRule subRule = renderRule(w, opt, ps);
        if (subRule.hasDrawable()) {
            subRule.drawRule(p, opt->rect);
            return;
        }
                                    }
        break;

    case PE_IndicatorMenuCheckMark:
        pseudoElement = PseudoElement_MenuCheckMark;
        break;

    case PE_IndicatorArrowLeft:
        pseudoElement = PseudoElement_LeftArrow;
        break;

    case PE_IndicatorArrowRight:
        pseudoElement = PseudoElement_RightArrow;
        break;

    case PE_IndicatorColumnViewArrow:
#if QT_CONFIG(itemviews)
        if (const QStyleOptionViewItem *viewOpt = qstyleoption_cast<const QStyleOptionViewItem *>(opt)) {
            bool reverse = (viewOpt->direction == Qt::RightToLeft);
            pseudoElement = reverse ? PseudoElement_LeftArrow : PseudoElement_RightArrow;
        } else
#endif
        {
            pseudoElement = PseudoElement_RightArrow;
        }
        break;

#if QT_CONFIG(itemviews)
    case PE_IndicatorBranch:
        if (const QStyleOptionViewItem *vopt = qstyleoption_cast<const QStyleOptionViewItem *>(opt)) {
            QRenderRule subRule = renderRule(w, opt, PseudoElement_TreeViewBranch);
            if (subRule.hasDrawable()) {
                proxy()->drawPrimitive(PE_PanelItemViewRow, vopt, p, w);
                subRule.drawRule(p, opt->rect);
            } else {
                baseStyle()->drawPrimitive(pe, vopt, p, w);
            }
        }
        return;
#endif // QT_CONFIG(itemviews)

    case PE_PanelTipLabel:
        if (!rule.hasDrawable())
            break;

        if (const QStyleOptionFrame *frmOpt = qstyleoption_cast<const QStyleOptionFrame *>(opt)) {
            if (rule.hasNativeBorder()) {
                rule.drawBackground(p, opt->rect);
                QStyleOptionFrame optCopy(*frmOpt);
                optCopy.rect = rule.borderRect(opt->rect);
                optCopy.palette.setBrush(QPalette::Window, Qt::NoBrush); // oh dear
                baseStyle()->drawPrimitive(pe, &optCopy, p, w);
            } else {
                rule.drawRule(p, opt->rect);
            }
        }
        return;

    case PE_FrameGroupBox:
        if (rule.hasNativeBorder())
            break;
        rule.drawBorder(p, opt->rect);
        return;

#if QT_CONFIG(tabwidget)
    case PE_FrameTabWidget:
        if (const QStyleOptionTabWidgetFrame *frm = qstyleoption_cast<const QStyleOptionTabWidgetFrame *>(opt)) {
            QRenderRule subRule = renderRule(w, opt, PseudoElement_TabWidgetPane);
            if (subRule.hasNativeBorder()) {
                subRule.drawBackground(p, opt->rect);
                QStyleOptionTabWidgetFrame frmCopy(*frm);
                subRule.configurePalette(&frmCopy.palette, QPalette::WindowText, QPalette::Window);
                baseStyle()->drawPrimitive(pe, &frmCopy, p, w);
            } else {
                subRule.drawRule(p, opt->rect);
            }
            return;
        }
        break;
#endif // QT_CONFIG(tabwidget)

    case PE_IndicatorProgressChunk:
        pseudoElement = PseudoElement_ProgressBarChunk;
        break;

    case PE_IndicatorTabTear:
        pseudoElement = PseudoElement_TabBarTear;
        break;

    case PE_FrameFocusRect:
        if (!rule.hasNativeOutline()) {
            rule.drawOutline(p, opt->rect);
            return;
        }
        break;

    case PE_IndicatorDockWidgetResizeHandle:
        pseudoElement = PseudoElement_DockWidgetSeparator;
        break;

    case PE_PanelItemViewRow:
        // For compatibility reasons, QTreeView draws different parts of
        // the background of an item row separately, before calling the
        // delegate to draw the item. The row background of an item is
        // however not separately styleable through a style sheet, but
        // only indirectly through the background of the item. To get the
        // same background for all parts drawn by QTreeView, we have to
        // use the background rule for the item here.
        if (const QStyleOptionViewItem *vopt = qstyleoption_cast<const QStyleOptionViewItem *>(opt)) {
            // default handling for drawing empty space
            if (vopt->viewItemPosition == QStyleOptionViewItem::Invalid)
                break;
            if (QRenderRule rule = renderRule(w, opt, PseudoElement_ViewItem); rule.hasBackground()) {
                // if the item background is not fully opaque, then we have to paint the row
                if (rule.background()->brush.color().alpha() != 1.0)
                    baseStyle()->drawPrimitive(pe, opt, p, w);
                // Skip border for the branch and draw only the brackground
                if (vopt->features & QStyleOptionViewItem::IsDecorationForRootColumn &&
                    (vopt->viewItemPosition == QStyleOptionViewItem::Beginning ||
                     vopt->viewItemPosition == QStyleOptionViewItem::OnlyOne) && rule.hasBorder()) {
                    if (rule.hasDrawable()) {
                        rule.drawBackground(p, rect);
                        rule.drawImage(p, rule.contentsRect(rect));
                    } else {
                        baseStyle()->drawPrimitive(pe, opt, p, w);
                    }
                    return;
                }
                pseudoElement = PseudoElement_ViewItem;
            }
        }
        break;
    case PE_PanelItemViewItem:
        pseudoElement = PseudoElement_ViewItem;
        break;

    case PE_PanelScrollAreaCorner:
        pseudoElement = PseudoElement_ScrollAreaCorner;
        break;

    case PE_IndicatorSpinDown:
    case PE_IndicatorSpinMinus:
        pseudoElement = PseudoElement_SpinBoxDownArrow;
        break;

    case PE_IndicatorSpinUp:
    case PE_IndicatorSpinPlus:
        pseudoElement = PseudoElement_SpinBoxUpArrow;
        break;
#if QT_CONFIG(tabbar)
    case PE_IndicatorTabClose:
        if (w) {
            // QMacStyle needs a real widget, not its parent - to implement
            // 'document mode' properly, drawing nothing if a tab is not hovered.
            baseStyle()->setProperty("_q_styleSheetRealCloseButton", QVariant::fromValue((void *)w));
            w = w->parentWidget(); //match on the QTabBar instead of the CloseButton
        }
        pseudoElement = PseudoElement_TabBarTabCloseButton;
        break;
#endif

    default:
        break;
    }

    if (pseudoElement != PseudoElement_None) {
        QRenderRule subRule = renderRule(w, opt, pseudoElement);
        if (subRule.hasDrawable()) {
            subRule.drawRule(p, rect);
        } else {
            baseStyle()->drawPrimitive(pe, opt, p, w);
        }
    } else {
        baseStyle()->drawPrimitive(pe, opt, p, w);
    }

    if (baseStyle()->property("_q_styleSheetRealCloseButton").toBool())
        baseStyle()->setProperty("_q_styleSheetRealCloseButton", QVariant());
}